

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O2

int orientation(double x1,double y1,double x2,double y2,double *twice_signed_area)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qb;
  double dVar5;
  undefined1 auVar6 [16];
  
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = y1;
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = x2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = x1 * y2;
  auVar1 = vfmsub231sd_fma(auVar6,auVar1,auVar2);
  dVar5 = auVar1._0_8_;
  *twice_signed_area = dVar5;
  iVar3 = 1;
  if (0.0 < dVar5) {
    return iVar3;
  }
  iVar4 = -1;
  if (0.0 <= dVar5) {
    if (y1 < y2) {
      return iVar3;
    }
    if ((y1 <= y2) && (iVar4 = iVar3, x1 <= x2)) {
      return -(uint)(x1 < x2);
    }
  }
  return iVar4;
}

Assistant:

static int orientation(double x1, double y1, double x2, double y2, double &twice_signed_area)
{
   twice_signed_area=y1*x2-x1*y2;
   if(twice_signed_area>0) return 1;
   else if(twice_signed_area<0) return -1;
   else if(y2>y1) return 1;
   else if(y2<y1) return -1;
   else if(x1>x2) return 1;
   else if(x1<x2) return -1;
   else return 0; // only true when x1==x2 and y1==y2
}